

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

String * __thiscall asl::String::operator=(String *this,char *x)

{
  String s;
  char local_18 [16];
  
  local_18[0] = *x;
  local_18[1] = 0;
  assign(this,local_18,1);
  return this;
}

Assistant:

String& operator=(const T& x) { String s=x; *this = s; return *this; }